

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

bool __thiscall QStyleSheetStyle::initObject(QStyleSheetStyle *this,QObject *obj)

{
  QStyleSheetStyleCaches *pQVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  long extraout_RAX;
  QWidget *pQVar5;
  long lVar6;
  QMetaObject *pQVar7;
  long in_FS_OFFSET;
  code *local_68;
  ImplFn local_60;
  QObject local_58 [8];
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (obj == (QObject *)0x0) {
    bVar3 = 0;
    goto LAB_00359b70;
  }
  lVar6 = *(long *)(obj + 8);
  if ((*(byte *)(lVar6 + 0x30) & 1) == 0) {
LAB_00359aa5:
    bVar3 = (byte)lVar6;
    bVar2 = true;
  }
  else {
    bVar2 = QWidget::testAttribute_helper((QWidget *)obj,WA_StyleSheet);
    if (bVar2) {
      bVar3 = 1;
      bVar2 = false;
    }
    else {
      if (*(char *)(*(long *)(obj + 0x20) + 0xc) != '\x11') {
        QWidget::styleSheet(&local_50,(QWidget *)obj);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((local_50.d.size != 0) ||
           (((pQVar5 = containerWidget((QWidget *)obj), pQVar5 == (QWidget *)obj &&
             ((lVar6 = QMetaObject::cast((QObject *)&QFrame::staticMetaObject), lVar6 == 0 ||
              (lVar6 = QMetaObject::cast((QObject *)&QComboBox::staticMetaObject), lVar6 == 0)))) &&
            ((pQVar7 = (QMetaObject *)(*(code *)**(undefined8 **)obj)(obj),
             pQVar7 != &QWidget::staticMetaObject ||
             (lVar6 = QMetaObject::cast((QObject *)&QTabBar::staticMetaObject), lVar6 == 0)))))) {
          QWidget::setAttribute((QWidget *)obj,WA_StyleSheet,true);
          lVar6 = extraout_RAX;
          goto LAB_00359aa5;
        }
      }
      bVar2 = false;
      bVar3 = 0;
    }
  }
  pQVar1 = styleSheetCaches;
  if (bVar2) {
    local_68 = QStyleSheetStyleCaches::objectDestroyed;
    local_60 = (ImplFn)0x0;
    local_50.d.d = (Data *)QObject::destroyed;
    local_50.d.ptr = (char16_t *)0x0;
    puVar4 = (undefined4 *)operator_new(0x20);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::
         QCallableObject<void_(QStyleSheetStyleCaches::*)(QObject_*),_QtPrivate::List<QObject_*>,_void>
         ::impl;
    *(code **)(puVar4 + 4) = QStyleSheetStyleCaches::objectDestroyed;
    *(undefined8 *)(puVar4 + 6) = 0;
    QObject::connectImpl
              (local_58,(void **)obj,(QObject *)&local_50,(void **)pQVar1,
               (QSlotObjectBase *)&local_68,(ConnectionType)puVar4,(int *)0x80,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    bVar3 = 1;
  }
LAB_00359b70:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QStyleSheetStyle::initObject(const QObject *obj) const
{
    if (!obj)
        return false;
    if (const QWidget *w = qobject_cast<const QWidget*>(obj)) {
        if (w->testAttribute(Qt::WA_StyleSheet))
            return true;
        if (unstylable(w))
            return false;
        const_cast<QWidget *>(w)->setAttribute(Qt::WA_StyleSheet, true);
    }

    connect(obj, &QObject::destroyed,
            styleSheetCaches, &QStyleSheetStyleCaches::objectDestroyed,
            Qt::UniqueConnection);
    return true;
}